

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O3

ssize_t __thiscall create::Serial::send(Serial *this,int __fd,void *__buf,size_t __n,int __flags)

{
  size_t sVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  error_code local_78;
  undefined **local_68 [3];
  error_category *local_50;
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  undefined *local_28;
  ulong local_20;
  
  local_28 = (undefined *)CONCAT44(in_register_00000034,__fd);
  if ((this->port).impl_.implementation_.descriptor_ == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[create::Serial] ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"send failed, not connected.",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    sVar2 = 0;
  }
  else {
    local_20 = (ulong)__buf & 0xffffffff;
    boost::system::error_code::error_code(&local_78);
    local_68[0] = &local_28;
    sVar1 = boost::asio::detail::
            write_buffer_sequence<boost::asio::basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::const_buffer_const*,boost::asio::detail::transfer_all_t>
                      (&this->port,&local_28,(system_error *)local_68,&local_78);
    if (local_78.failed_ == true) {
      std::runtime_error::runtime_error((runtime_error *)local_68,"write");
      local_48._M_p = (pointer)((long)&((system_error *)local_68)->m_what + 0x10);
      local_68[0] = &PTR__system_error_001566f0;
      local_50 = local_78.cat_;
      local_40 = 0;
      local_38._M_local_buf[0] = '\0';
      boost::throw_exception<boost::system::system_error>((system_error *)local_68);
    }
    sVar2 = CONCAT71((int7)(sVar1 >> 8),1);
  }
  return sVar2;
}

Assistant:

bool Serial::startReading() {
    if (!connected()) return false;

    if (!data) {
      CERR("[create::Serial] ", "data pointer not initialized.");
      return false;
    }

    // Only allow once
    if (isReading) return true;

    // Start OI
    sendOpcode(OC_START);

    if (!startSensorStream()) return false;

    io.reset();

    // Start continuously reading one byte at a time
    boost::asio::async_read(port,
                            boost::asio::buffer(&byteRead, 1),
                            std::bind(&Serial::onData,
                                      shared_from_this(),
                                      std::placeholders::_1,
                                      std::placeholders::_2));

    ioThread = std::thread(std::bind(
        static_cast<std::size_t(boost::asio::io_service::*)(void)>(
          &boost::asio::io_service::run), &io));

    // Wait for first complete read to finish
    std::unique_lock<std::mutex> lock(dataReadyMut);

    int attempts = 1;
    int maxAttempts = 10;
    while (!dataReady) {
      if (dataReadyCond.wait_for(lock, std::chrono::milliseconds(500)) == std::cv_status::timeout) {
        if (attempts >= maxAttempts) {
          CERR("[create::Serial] ", "failed to receive data from Create. Check if robot is powered!");
          io.stop();
          ioThread.join();
          return false;
        }
        attempts++;

        // Request data again
        sendOpcode(OC_START);
        startSensorStream();
      }
    }

    isReading = true;
    return true;
  }